

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::SetHomeOutputDirectory(cmake *this,string *dir)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *dir_local;
  cmake *this_local;
  
  local_18 = dir;
  dir_local = (string *)this;
  cmState::SetBinaryDirectory(this->State,dir);
  bVar1 = cmStateSnapshot::IsValid(&this->CurrentSnapshot);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"CMAKE_BINARY_DIR",&local_39);
    cmStateSnapshot::SetDefinition(&this->CurrentSnapshot,&local_38,local_18);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

void cmake::SetHomeOutputDirectory(const std::string& dir)
{
  this->State->SetBinaryDirectory(dir);
  if (this->CurrentSnapshot.IsValid()) {
    this->CurrentSnapshot.SetDefinition("CMAKE_BINARY_DIR", dir);
  }
}